

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
generateDrawData(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  pointer pVVar1;
  uint uVar2;
  uint uVar3;
  deUint32 idx;
  ulong uVar4;
  pointer pPVar5;
  float fVar6;
  float fVar7;
  Random rnd;
  Vector<float,_4> local_d8;
  float local_c8;
  DrawIndirectParams *local_b8;
  undefined1 local_b0 [8];
  pointer pPStack_a8;
  pointer pPStack_a0;
  pointer local_98;
  DrawFunction local_90 [2];
  float afStack_88 [4];
  float local_78;
  deRandom local_68;
  Vec4 local_58;
  Vec4 local_48;
  
  pVVar1 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  deRandom_init(&local_68,pVVar1->vertexCount ^ pVVar1->firstVertex ^ 0xc2a39f);
  uVar3 = 0;
  for (pVVar1 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar1 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar1 = pVVar1 + 1) {
    uVar2 = pVVar1->vertexCount + pVVar1->firstVertex;
    if (uVar3 < uVar2) {
      uVar3 = uVar2;
    }
  }
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 0.0;
  PositionColorVertex::PositionColorVertex((PositionColorVertex *)&local_98,&local_48,&local_58);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         local_b0,(ulong)uVar3,(value_type *)&local_98,(allocator_type *)&local_d8);
  local_b8 = &this->m_data;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  _M_move_assign((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)local_b8,(VecAccess<float,_4,_4> *)local_b0);
  std::_Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ::~_Vector_base((_Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                   *)local_b0);
  for (pVVar1 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar1 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar1 = pVVar1 + 1) {
    pPVar5 = (local_b8->super_DrawParamsBase).vertices.
             super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
             ._M_impl.super__Vector_impl_data._M_start + pVVar1->firstVertex;
    for (uVar4 = 0; uVar4 < pVVar1->vertexCount; uVar4 = uVar4 + 1) {
      local_90[0] = FUNCTION_DRAW;
      local_90[1] = FUNCTION_DRAW_INDEXED;
      afStack_88[0] = 2.8026e-45;
      afStack_88[1] = 4.2039e-45;
      local_98 = pPVar5;
      local_c8 = deRandom_getFloat(&local_68);
      fVar6 = deRandom_getFloat(&local_68);
      local_b0._4_4_ = fVar6 + fVar6 + -1.0;
      local_b0._0_4_ = local_c8 + local_c8 + -1.0;
      pPStack_a8 = (pointer)&DAT_3f8000003f800000;
      tcu::VecAccess<float,_4,_4>::operator=
                ((VecAccess<float,_4,_4> *)&local_98,(Vector<float,_4> *)local_b0);
      local_b0 = (undefined1  [8])&pPVar5->color;
      pPStack_a8 = (pointer)0x100000000;
      pPStack_a0 = (pointer)0x300000002;
      local_c8 = deRandom_getFloat(&local_68);
      fVar6 = deRandom_getFloat(&local_68);
      local_78 = deRandom_getFloat(&local_68);
      fVar7 = deRandom_getFloat(&local_68);
      local_d8.m_data[0] = local_c8 + 0.0;
      local_d8.m_data[1] = fVar6 + 0.0;
      local_d8.m_data[3] = fVar7 + 0.0;
      local_d8.m_data[2] = local_78 + 0.0;
      tcu::VecAccess<float,_4,_4>::operator=((VecAccess<float,_4,_4> *)local_b0,&local_d8);
      pPVar5 = pPVar5 + 1;
    }
  }
  return;
}

Assistant:

void DrawTestInstance<DrawIndirectParams>::generateDrawData (void)
{
	de::Random	rnd(SEED ^ m_data.commands[0].vertexCount ^ m_data.commands[0].firstVertex);

	deUint32 lastIndex	= 0;

	// Find the interval which will be used
	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		const deUint32	index = it->firstVertex + it->vertexCount;
		lastIndex	= (index > lastIndex) ? index : lastIndex;
	}

	// Initialize with zeros
	m_data.vertices = std::vector<PositionColorVertex>(lastIndex, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Generate random vertices only where necessary
	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		std::vector<PositionColorVertex>::iterator vertexStart = m_data.vertices.begin() + it->firstVertex;

		for (deUint32 idx = 0; idx < it->vertexCount; ++idx)
		{
			std::vector<PositionColorVertex>::iterator vertexIt = vertexStart + idx;

			tcu::VecAccess<float, 4, 4> positionAccess = vertexIt->position.xyzw();
			positionAccess = tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0);

			tcu::VecAccess<float, 4, 4> colorAccess = vertexIt->color.xyzw();
			colorAccess = tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0));
		}
	}
}